

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O3

int fetch_all_calendar_records_db(feed_db_t *db,calendar_record_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  calendar_record_t *pcVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  sqlite3_stmt *stmt;
  calendar_record_t record;
  char qr [119];
  sqlite3_stmt *local_120;
  calendar_record_t local_118;
  char local_a8 [112];
  undefined4 uStack_38;
  undefined3 uStack_34;
  
  bVar10 = 0;
  uVar2 = count_rows_db(db,"calendar");
  if (0 < (int)uVar2) {
    pcVar8 = 
    "SELECT service_id,monday, tuesday, wednesday, thursday, friday, saturday, sunday,start_date, end_date FROM `calendar`;"
    ;
    pcVar9 = local_a8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 8;
      pcVar9 = pcVar9 + (ulong)bVar10 * -0x10 + 8;
    }
    uStack_34 = 0x3b60;
    uStack_38 = 0x7261646e;
    sqlite3_prepare_v2(db->conn,local_a8,-1,&local_120,(char **)0x0);
    pcVar4 = (calendar_record_t *)malloc((ulong)uVar2 * 0x70);
    *records = pcVar4;
    uVar1 = 0xffffffff;
    if (pcVar4 != (calendar_record_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_120);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_calendar_record(&local_118);
        puVar5 = sqlite3_column_text(local_120,0);
        strcpy(local_118.service_id,(char *)puVar5);
        local_118.monday = sqlite3_column_int(local_120,1);
        local_118.tuesday = sqlite3_column_int(local_120,2);
        local_118.wednesday = sqlite3_column_int(local_120,3);
        local_118.thursday = sqlite3_column_int(local_120,4);
        local_118.friday = sqlite3_column_int(local_120,5);
        local_118.saturday = sqlite3_column_int(local_120,6);
        local_118.sunday = sqlite3_column_int(local_120,7);
        puVar5 = sqlite3_column_text(local_120,8);
        strcpy(local_118.start_date,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_120,9);
        strcpy(local_118.end_date,(char *)puVar5);
        pcVar4 = &local_118;
        pcVar8 = (*records)->service_id + lVar6;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pcVar8 = *(undefined4 *)pcVar4->service_id;
          pcVar4 = (calendar_record_t *)((long)pcVar4 + (ulong)bVar10 * -8 + 4);
          pcVar8 = pcVar8 + ((ulong)bVar10 * -2 + 1) * 4;
        }
        lVar6 = lVar6 + 0x70;
      } while ((ulong)uVar2 * 0x70 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_120);
  }
  return uVar2;
}

Assistant:

int fetch_all_calendar_records_db(feed_db_t *db, calendar_record_t **records) {

    calendar_record_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "calendar");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "service_id,"
                    "monday, tuesday, wednesday, thursday, friday, saturday, sunday,"
                    "start_date, end_date "
                "FROM `calendar`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_calendar_record(&record);

        strcpy(record.service_id, sqlite3_column_text(stmt, 0));
        record.monday = sqlite3_column_int(stmt, 1);
        record.tuesday = sqlite3_column_int(stmt, 2);
        record.wednesday = sqlite3_column_int(stmt, 3);
        record.thursday = sqlite3_column_int(stmt, 4);
        record.friday = sqlite3_column_int(stmt, 5);
        record.saturday = sqlite3_column_int(stmt, 6);
        record.sunday = sqlite3_column_int(stmt, 7);
        strcpy(record.start_date, sqlite3_column_text(stmt, 8));
        strcpy(record.end_date, sqlite3_column_text(stmt, 9));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}